

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline<nivalis::point>
          (ImDrawList *this,point *points,int points_count,ImU32 col,bool closed,float thickness)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ImDrawCmd *pIVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 IVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  long lVar10;
  ImVec2 IVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  ImU32 IVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  uint uVar25;
  uint uVar26;
  float **ppfVar27;
  int iVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float in_XMM9_Da;
  float fVar49;
  float fVar50;
  float in_XMM9_Db;
  float fVar51;
  float in_XMM11_Da;
  float in_XMM11_Db;
  float fVar52;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM15_Da;
  float in_XMM15_Db;
  int local_1bc;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  if (1 < points_count) {
    IVar7 = this->_Data->TexUvWhitePixel;
    uVar2 = points_count - 1;
    uVar16 = (ulong)uVar2;
    if (closed) {
      uVar16 = (ulong)(uint)points_count;
    }
    uVar5 = this->Flags;
    uVar17 = col & 0xffffff;
    iVar28 = (int)uVar16;
    if (1.0 < thickness || (uVar5 & 1) == 0) {
      iVar18 = (uVar5 & 1) * 3 + 3;
      iVar1 = 9;
      if ((uVar5 & 1) != 0) {
        thickness = thickness + -1.0;
        iVar1 = 0x1b;
      }
      PrimReserve(this,iVar1 * iVar28,iVar18 * points_count);
      fVar43 = thickness * 0.5;
      fVar32 = fVar43 + 1.0;
      uVar6 = this->_VtxCurrentIdx;
      uVar16 = (ulong)(uint)points_count;
      fVar46 = 0.0;
      if (closed) {
        in_XMM9_Da = *points->x - *points[uVar16 - 1].x;
        in_XMM9_Db = *points->y - *points[uVar16 - 1].y;
        fVar46 = in_XMM9_Da * in_XMM9_Da + in_XMM9_Db * in_XMM9_Db;
        if (0.0 < fVar46) {
          if (fVar46 < 0.0) {
            fVar33 = sqrtf(fVar46);
          }
          else {
            fVar33 = SQRT(fVar46);
          }
          in_XMM9_Da = in_XMM9_Da * (1.0 / fVar33);
          in_XMM9_Db = in_XMM9_Db * (1.0 / fVar33);
        }
      }
      iVar1 = (uVar5 & 1) * 2 + 2;
      if (points_count < 2) {
        points_count = 1;
      }
      ppfVar27 = &points->y;
      iVar29 = 0;
      local_1bc = 0;
      uVar22 = 0;
      do {
        uVar13 = uVar22 + 1;
        uVar14 = 0;
        if (uVar16 - 1 != uVar22) {
          uVar14 = uVar13;
        }
        fVar44 = *ppfVar27[-1] - *points[uVar14].x;
        fVar45 = **ppfVar27 - *points[uVar14].y;
        fVar33 = fVar44 * fVar44 + fVar45 * fVar45;
        if (0.0 < fVar33) {
          if (fVar33 < 0.0) {
            fVar34 = sqrtf(fVar33);
          }
          else {
            fVar34 = SQRT(fVar33);
          }
          fVar44 = fVar44 * (1.0 / fVar34);
          fVar45 = fVar45 * (1.0 / fVar34);
        }
        if (uVar22 == 0 && !closed) {
          in_XMM9_Da = -fVar44;
          in_XMM9_Db = -fVar45;
          fVar34 = fVar33;
        }
        else {
          fVar34 = fVar46;
          if (uVar2 == uVar22 && !closed) {
            fVar44 = -in_XMM9_Da;
            fVar45 = -in_XMM9_Db;
            fVar33 = fVar46;
          }
        }
        fVar46 = fVar33;
        fVar52 = -in_XMM9_Db;
        fVar48 = in_XMM9_Da * fVar45 - fVar44 * in_XMM9_Db;
        fVar33 = in_XMM9_Da * fVar44 + fVar45 * in_XMM9_Db;
        if (ABS(fVar48) <= 1e-05) {
          fVar34 = **ppfVar27;
          fVar49 = *ppfVar27[-1];
          fVar35 = in_XMM9_Db * fVar43 + fVar49;
          fVar36 = -in_XMM9_Da * fVar43 + fVar34;
          fVar50 = fVar52 * fVar43 + fVar49;
          fVar51 = in_XMM9_Da * fVar43 + fVar34;
          if ((uVar5 & 1) != 0) {
            in_XMM13_Da = in_XMM9_Db * fVar32 + fVar49;
            in_XMM13_Db = -in_XMM9_Da * fVar32 + fVar34;
            in_XMM11_Da = fVar52 * fVar32 + fVar49;
            in_XMM11_Db = in_XMM9_Da * fVar32 + fVar34;
          }
        }
        else {
          fVar49 = fVar43 / fVar48;
          if (1e-05 < fVar33) {
            fVar35 = fVar46;
            if (fVar34 <= fVar46) {
              fVar35 = fVar34;
            }
            fVar34 = ((fVar44 + in_XMM9_Da) * (fVar44 + in_XMM9_Da) +
                     (fVar45 + in_XMM9_Db) * (fVar45 + in_XMM9_Db)) * fVar49 * fVar49;
            if (fVar35 < fVar34) {
              fVar35 = fVar35 / fVar34;
              if (fVar35 < 0.0) {
                fVar35 = sqrtf(fVar35);
              }
              else {
                fVar35 = SQRT(fVar35);
              }
              fVar49 = fVar49 * fVar35;
            }
          }
          fVar37 = fVar44 + in_XMM9_Da;
          fVar38 = fVar45 + in_XMM9_Db;
          fVar34 = **ppfVar27;
          fVar47 = *ppfVar27[-1];
          fVar35 = fVar47 - fVar49 * fVar37;
          fVar36 = fVar34 - fVar49 * fVar38;
          fVar50 = fVar49 * fVar37 + fVar47;
          fVar51 = fVar49 * fVar38 + fVar34;
          if ((uVar5 & 1) != 0) {
            fVar49 = fVar32 / fVar48;
            in_XMM13_Da = -fVar37 * fVar49 + fVar47;
            in_XMM13_Db = -fVar38 * fVar49 + fVar34;
            in_XMM11_Da = fVar49 * fVar37 + fVar47;
            in_XMM11_Db = fVar49 * fVar38 + fVar34;
          }
        }
        iVar15 = ((fVar48 < 0.0) - 1) + (uint)(fVar48 < 0.0);
        if (fVar33 <= 1e-05) {
          iVar19 = 4;
          iVar12 = 2;
        }
        else {
          fVar49 = (float)-iVar15;
          fVar47 = fVar52 * fVar49 + in_XMM9_Da;
          in_XMM9_Db = in_XMM9_Da * fVar49 + in_XMM9_Db;
          fVar34 = **ppfVar27;
          fVar48 = *ppfVar27[-1];
          in_XMM14_Da = fVar47 * fVar43 + fVar48;
          in_XMM14_Db = in_XMM9_Db * fVar43 + fVar34;
          fVar52 = fVar45 * fVar49 + fVar44;
          fVar49 = -fVar44 * fVar49 + fVar45;
          in_XMM15_Da = fVar52 * fVar43 + fVar48;
          in_XMM15_Db = fVar49 * fVar43 + fVar34;
          iVar19 = 6;
          iVar12 = 3;
          if ((uVar5 & 1) != 0) {
            local_58 = fVar47 * fVar32 + fVar48;
            fStack_54 = in_XMM9_Db * fVar32 + fVar34;
            local_68 = fVar52 * fVar32 + fVar48;
            fStack_64 = fVar49 * fVar32 + fVar34;
          }
        }
        bVar30 = 1e-05 < fVar33;
        if ((uVar5 & 1) != 0) {
          iVar12 = iVar19;
        }
        bVar31 = 0 < iVar15;
        bVar23 = bVar31 && bVar30;
        bVar24 = iVar15 < 0 && bVar30;
        pIVar8 = this->_VtxWritePtr;
        uVar20 = (uint)bVar23;
        uVar39 = (int)(uVar20 << 0x1f) >> 0x1f;
        uVar41 = (int)(uVar20 << 0x1f) >> 0x1f;
        pIVar8->pos = (ImVec2)(CONCAT44(~uVar41 & (uint)fVar36,~uVar39 & (uint)fVar35) |
                              CONCAT44((uint)in_XMM14_Db & uVar41,(uint)in_XMM14_Da & uVar39));
        pIVar8->uv = IVar7;
        pIVar8 = this->_VtxWritePtr;
        pIVar8->col = col;
        uVar39 = (uint)bVar24;
        uVar41 = (uint)bVar24;
        uVar40 = (int)(uVar41 << 0x1f) >> 0x1f;
        uVar42 = (int)(uVar41 << 0x1f) >> 0x1f;
        pIVar8[1].pos =
             (ImVec2)(CONCAT44(~uVar42 & (uint)fVar51,~uVar40 & (uint)fVar50) |
                     CONCAT44((uint)in_XMM14_Db & uVar42,(uint)in_XMM14_Da & uVar40));
        pIVar8[1].uv = IVar7;
        pIVar8 = this->_VtxWritePtr;
        pIVar8[1].col = col;
        if (1e-05 < fVar33) {
          lVar10 = (ulong)(uint)(iVar1 * 4) * 5;
          *(ulong *)((long)&(pIVar8->pos).x + lVar10) = CONCAT44(in_XMM15_Db,in_XMM15_Da);
          *(ImVec2 *)((long)&(pIVar8->uv).x + lVar10) = IVar7;
          *(ImU32 *)((long)&this->_VtxWritePtr->col + lVar10) = col;
        }
        if ((uVar5 & 1) != 0) {
          uVar14 = CONCAT44((int)(uVar20 << 0x1f) >> 0x1f,(int)(uVar20 << 0x1f) >> 0x1f);
          pIVar8 = this->_VtxWritePtr;
          pIVar8[2].pos =
               (ImVec2)(~uVar14 & CONCAT44(in_XMM13_Db,in_XMM13_Da) |
                       CONCAT44(fStack_54,local_58) & uVar14);
          pIVar8[2].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[2].col = uVar17;
          uVar14 = CONCAT44((int)(uVar41 << 0x1f) >> 0x1f,(int)(uVar41 << 0x1f) >> 0x1f);
          pIVar8[3].pos =
               (ImVec2)(~uVar14 & CONCAT44(in_XMM11_Db,in_XMM11_Da) |
                       CONCAT44(fStack_54,local_58) & uVar14);
          pIVar8[3].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[3].col = uVar17;
          if (1e-05 < fVar33) {
            IVar11.y = fStack_64;
            IVar11.x = local_68;
            pIVar8[5].pos = IVar11;
            pIVar8[5].uv = IVar7;
            this->_VtxWritePtr[5].col = uVar17;
          }
        }
        this->_VtxWritePtr =
             (ImDrawVert *)((long)&(this->_VtxWritePtr->pos).x + (ulong)(uint)(iVar12 * 0x14));
        if ((long)uVar22 < (long)iVar28) {
          uVar20 = this->_VtxCurrentIdx;
          uVar40 = uVar20 + iVar12;
          if ((long)(int)uVar2 <= (long)uVar22) {
            uVar40 = uVar6;
          }
          iVar19 = 0;
          if (bVar31 && bVar30) {
            iVar19 = iVar1;
          }
          uVar42 = iVar19 + uVar20;
          iVar19 = 1;
          if (iVar15 < 0 && bVar30) {
            iVar19 = iVar1;
          }
          uVar25 = iVar19 + uVar20;
          uVar26 = uVar40 + 1;
          puVar9 = this->_IdxWritePtr;
          *puVar9 = uVar42;
          puVar9[1] = uVar25;
          puVar9[2] = uVar26;
          puVar9[3] = uVar42;
          puVar9[4] = uVar26;
          puVar9[5] = uVar40;
          this->_IdxWritePtr = puVar9 + 6;
          if (fVar33 <= 1e-05) {
            local_1bc = local_1bc + 3;
          }
          else {
            puVar9[6] = uVar42;
            puVar9[7] = uVar25;
            puVar9[8] = uVar20 + (!bVar31 || !bVar30);
            this->_IdxWritePtr = puVar9 + 9;
          }
          if ((uVar5 & 1) != 0) {
            puVar9 = this->_IdxWritePtr;
            uVar20 = this->_VtxCurrentIdx + 2 + (uint)bVar23 + (uint)bVar23 * 2;
            uVar3 = this->_VtxCurrentIdx + 3 + uVar39 * 2;
            *puVar9 = uVar20;
            puVar9[1] = uVar42;
            puVar9[2] = uVar40;
            puVar9[3] = uVar20;
            puVar9[4] = uVar40;
            puVar9[5] = uVar40 + 2;
            puVar9[6] = uVar3;
            puVar9[7] = uVar25;
            puVar9[8] = uVar26;
            puVar9[9] = uVar3;
            puVar9[10] = uVar26;
            puVar9[0xb] = uVar40 + 3;
            this->_IdxWritePtr = puVar9 + 0xc;
            if (fVar33 <= 1e-05) {
              local_1bc = local_1bc + 6;
            }
            else {
              puVar9[0xc] = this->_VtxCurrentIdx + (2 - uVar41);
              puVar9[0xd] = uVar39 * 3 + this->_VtxCurrentIdx;
              puVar9[0xe] = this->_VtxCurrentIdx + uVar39 + 4;
              puVar9[0xf] = (2 - uVar41) + this->_VtxCurrentIdx;
              puVar9[0x10] = uVar39 + 4 + this->_VtxCurrentIdx;
              puVar9[0x11] = (uVar39 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar9 + 0x12;
            }
          }
        }
        in_XMM9_Da = -fVar44;
        in_XMM9_Db = -fVar45;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar12;
        iVar29 = (iVar29 + iVar18) - iVar12;
        ppfVar27 = ppfVar27 + 3;
        uVar22 = uVar13;
      } while ((uint)points_count != uVar13);
      pIVar4 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
      pIVar4->ElemCount = pIVar4->ElemCount - local_1bc;
      (this->VtxBuffer).Size = (this->VtxBuffer).Size - iVar29;
      (this->IdxBuffer).Size = (this->IdxBuffer).Size - local_1bc;
    }
    else {
      PrimReserve(this,iVar28 * 0xc,iVar28 * 6);
      if (0 < iVar28) {
        IVar21 = (int)((float)(col >> 0x18) * thickness) * 0x1000000 + uVar17;
        ppfVar27 = &points->y;
        uVar22 = 1;
        do {
          uVar13 = uVar22;
          if ((uint)points_count == uVar22) {
            uVar13 = 0;
          }
          fVar43 = *points[uVar13].x - *ppfVar27[-1];
          fVar46 = *points[uVar13].y - **ppfVar27;
          fVar32 = fVar43 * fVar43 + fVar46 * fVar46;
          if (0.0 < fVar32) {
            if (fVar32 < 0.0) {
              fVar32 = sqrtf(fVar32);
            }
            else {
              fVar32 = SQRT(fVar32);
            }
            fVar43 = fVar43 * (1.0 / fVar32);
            fVar46 = fVar46 * (1.0 / fVar32);
          }
          pIVar8 = this->_VtxWritePtr;
          (pIVar8->pos).x = *ppfVar27[-1] + fVar46;
          (pIVar8->pos).y = **ppfVar27 - fVar43;
          pIVar8->uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8->col = uVar17;
          pIVar8[1].pos.x = *ppfVar27[-1];
          pIVar8[1].pos.y = **ppfVar27;
          pIVar8[1].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[1].col = IVar21;
          pIVar8[2].pos.x = *ppfVar27[-1] - fVar46;
          pIVar8[2].pos.y = **ppfVar27 + fVar43;
          pIVar8[2].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[2].col = uVar17;
          pIVar8[3].pos.x = *points[uVar13].x + fVar46;
          pIVar8[3].pos.y = *points[uVar13].y - fVar43;
          pIVar8[3].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[3].col = uVar17;
          pIVar8[4].pos.x = *points[uVar13].x;
          pIVar8[4].pos.y = *points[uVar13].y;
          pIVar8[4].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[4].col = IVar21;
          pIVar8[5].pos.x = *points[uVar13].x - fVar46;
          pIVar8[5].pos.y = fVar43 + *points[uVar13].y;
          pIVar8[5].uv = IVar7;
          pIVar8 = this->_VtxWritePtr;
          pIVar8[5].col = uVar17;
          this->_VtxWritePtr = pIVar8 + 6;
          puVar9 = this->_IdxWritePtr;
          *puVar9 = this->_VtxCurrentIdx;
          puVar9[1] = this->_VtxCurrentIdx + 1;
          puVar9[2] = this->_VtxCurrentIdx + 4;
          puVar9[3] = this->_VtxCurrentIdx;
          puVar9[4] = this->_VtxCurrentIdx + 4;
          puVar9[5] = this->_VtxCurrentIdx + 3;
          puVar9[6] = this->_VtxCurrentIdx + 1;
          puVar9[7] = this->_VtxCurrentIdx + 2;
          puVar9[8] = this->_VtxCurrentIdx + 5;
          puVar9[9] = this->_VtxCurrentIdx + 1;
          puVar9[10] = this->_VtxCurrentIdx + 5;
          puVar9[0xb] = this->_VtxCurrentIdx + 4;
          this->_IdxWritePtr = puVar9 + 0xc;
          this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
          ppfVar27 = ppfVar27 + 3;
          bVar30 = uVar22 != uVar16;
          uVar22 = uVar22 + 1;
        } while (bVar30);
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}